

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void separatetobefnz(global_State *g,int all)

{
  GCObject *pGVar1;
  GCObject *local_30;
  GCObject **lastnext;
  GCObject **p;
  GCObject *curr;
  int all_local;
  global_State *g_local;
  
  local_30 = (GCObject *)findlast(&g->tobefnz);
  pGVar1 = (GCObject *)&g->finobj;
  while (lastnext = &pGVar1->next, pGVar1 = *lastnext, pGVar1 != (GCObject *)0x0) {
    if (((pGVar1->marked & 3) != 0) || (all != 0)) {
      *lastnext = pGVar1->next;
      pGVar1->next = local_30->next;
      local_30->next = pGVar1;
      local_30 = pGVar1;
      pGVar1 = (GCObject *)lastnext;
    }
  }
  return;
}

Assistant:

static void separatetobefnz (global_State *g, int all) {
  GCObject *curr;
  GCObject **p = &g->finobj;
  GCObject **lastnext = findlast(&g->tobefnz);
  while ((curr = *p) != NULL) {  /* traverse all finalizable objects */
    lua_assert(tofinalize(curr));
    if (!(iswhite(curr) || all))  /* not being collected? */
      p = &curr->next;  /* don't bother with it */
    else {
      *p = curr->next;  /* remove 'curr' from 'finobj' list */
      curr->next = *lastnext;  /* link at the end of 'tobefnz' list */
      *lastnext = curr;
      lastnext = &curr->next;
    }
  }
}